

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QByteArray> * __thiscall
QTzTimeZonePrivate::availableTimeZoneIds(QTzTimeZonePrivate *this,Territory territory)

{
  iterator __last2;
  bool bVar1;
  undefined1 uVar2;
  QTzTimeZone *pQVar3;
  iterator iVar4;
  iterator asize;
  iterator __first2;
  back_insert_iterator<QList<QByteArray>_> this_00;
  Territory in_DX;
  QList<QByteArray> *in_RDI;
  long in_FS_OFFSET;
  difference_type cldrSize;
  QList<QByteArray> *result;
  QList<QByteArray> joined;
  iterator it_1;
  QList<QByteArray> cldrList;
  iterator prunedEnd;
  iterator uniqueEnd;
  QList<QByteArrayView> cldrViews;
  anon_class_2_1_977e6eba_for__M_pred unWantedZone;
  const_iterator end;
  const_iterator it;
  QList<QByteArray> *in_stack_fffffffffffffdb8;
  QByteArrayView *in_stack_fffffffffffffdc0;
  const_iterator *in_stack_fffffffffffffdc8;
  iterator in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  iterator in_stack_fffffffffffffde0;
  iterator in_stack_fffffffffffffde8;
  anon_class_2_1_977e6eba_for__M_pred __pred;
  iterator in_stack_fffffffffffffdf0;
  back_insert_iterator<QList<QByteArray>_> in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  QList<QByteArray> *in_stack_fffffffffffffe08;
  iterator __last1;
  undefined8 in_stack_fffffffffffffe58;
  Territory territory_00;
  iterator local_90;
  QByteArray local_88;
  QByteArrayView *local_70;
  Territory local_62;
  QByteArrayView *local_60;
  iterator local_58;
  QByteArrayView *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  Territory local_2a;
  piter local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArray>::QList((QList<QByteArray> *)0x74fd8f);
  local_18.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_18.d = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
             0x74fdaa);
  local_18 = (piter)QHash<QByteArray,_QTzTimeZone>::cbegin
                              ((QHash<QByteArray,_QTzTimeZone> *)in_stack_fffffffffffffdd8.i);
  local_28.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
             0x74fdec);
  local_28 = (piter)QHash<QByteArray,_QTzTimeZone>::cend
                              ((QHash<QByteArray,_QTzTimeZone> *)in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = QHash<QByteArray,_QTzTimeZone>::const_iterator::operator!=
                      (in_stack_fffffffffffffdc8,(const_iterator *)in_stack_fffffffffffffdc0);
    territory_00 = (Territory)((ulong)in_stack_fffffffffffffe58 >> 0x30);
    if (!bVar1) break;
    pQVar3 = QHash<QByteArray,_QTzTimeZone>::const_iterator::value((const_iterator *)0x74fe3b);
    if (pQVar3->territory == in_DX) {
      QHash<QByteArray,_QTzTimeZone>::const_iterator::key((const_iterator *)0x74fe57);
      QList<QByteArray>::operator<<
                ((QList<QByteArray> *)in_stack_fffffffffffffdc0,
                 (parameter_type)in_stack_fffffffffffffdb8);
    }
    QHash<QByteArray,_QTzTimeZone>::const_iterator::operator++
              ((const_iterator *)in_stack_fffffffffffffdd0.i);
  }
  QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffdc0);
  iVar4 = QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffdc0);
  std::sort<QList<QByteArray>::iterator>
            ((iterator)in_stack_fffffffffffffdd8.i,(iterator)in_stack_fffffffffffffdd0.i);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_2a = in_DX;
  QTimeZonePrivate::matchingTimeZoneIds((QTimeZonePrivate *)iVar4.i,territory_00);
  QList<QByteArrayView>::begin((QList<QByteArrayView> *)in_stack_fffffffffffffdc0);
  QList<QByteArrayView>::end((QList<QByteArrayView> *)in_stack_fffffffffffffdc0);
  std::sort<QList<QByteArrayView>::iterator>(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  local_50 = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  asize = QList<QByteArrayView>::begin(in_stack_fffffffffffffdc0);
  QList<QByteArrayView>::end((QList<QByteArrayView> *)in_stack_fffffffffffffdc0);
  local_50 = (QByteArrayView *)
             std::unique<QList<QByteArrayView>::iterator>
                       (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  __pred.territory = (Territory)((ulong)in_stack_fffffffffffffde8.i >> 0x30);
  local_58.i = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QByteArrayView>::begin((QList<QByteArrayView> *)in_stack_fffffffffffffdc0);
  local_60 = local_50;
  local_62 = local_2a;
  local_58 = std::
             remove_if<QList<QByteArrayView>::iterator,QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                       ((iterator)in_stack_fffffffffffffdf8.container,in_stack_fffffffffffffdf0,
                        __pred);
  QList<QByteArrayView>::begin((QList<QByteArrayView> *)in_stack_fffffffffffffdc0);
  local_70 = local_58.i;
  iVar4.i = (QByteArray *)
            std::distance<QList<QByteArrayView>::iterator>
                      (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  if (iVar4.i != (QByteArray *)0x0) {
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    __last1.i = &local_88;
    QList<QByteArray>::QList((QList<QByteArray> *)0x75016f);
    QList<QByteArray>::reserve(in_stack_fffffffffffffe08,(qsizetype)asize.i);
    local_90.i = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
    __first2 = QList<QByteArrayView>::begin(in_stack_fffffffffffffdc0);
    local_90 = __first2;
    while (uVar2 = QList<QByteArrayView>::iterator::operator!=(&local_90,local_58), (bool)uVar2) {
      in_stack_fffffffffffffdf8.container =
           (QList<QByteArray> *)QList<QByteArrayView>::iterator::operator->(&local_90);
      QByteArrayView::toByteArray(in_stack_fffffffffffffdc0);
      QList<QByteArray>::emplace_back<QByteArray>
                ((QList<QByteArray> *)in_stack_fffffffffffffdc0,
                 (QByteArray *)in_stack_fffffffffffffdb8);
      QByteArray::~QByteArray((QByteArray *)0x75023a);
      QList<QByteArrayView>::iterator::operator++(&local_90);
    }
    QList<QByteArray>::QList((QList<QByteArray> *)0x7502e5);
    QList<QByteArray>::size(in_RDI);
    QList<QByteArray>::reserve((QList<QByteArray> *)__first2.i,(qsizetype)asize.i);
    QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffdc0);
    QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffdc0);
    QList<QByteArray>::begin((QList<QByteArray> *)in_stack_fffffffffffffdc0);
    QList<QByteArray>::end((QList<QByteArray> *)in_stack_fffffffffffffdc0);
    std::back_inserter<QList<QByteArray>>((QList<QByteArray> *)in_stack_fffffffffffffdc0);
    __last2.i._7_1_ = uVar2;
    __last2.i._0_7_ = in_stack_fffffffffffffe00;
    this_00 = std::
              set_union<QList<QByteArray>::iterator,QList<QByteArray>::iterator,std::back_insert_iterator<QList<QByteArray>>>
                        (iVar4,__last1,(iterator)__first2.i,__last2,in_stack_fffffffffffffdf8);
    QList<QByteArray>::operator=(this_00.container,in_stack_fffffffffffffdb8);
    QList<QByteArray>::~QList((QList<QByteArray> *)0x750414);
    QList<QByteArray>::~QList((QList<QByteArray> *)0x750421);
  }
  QList<QByteArrayView>::~QList((QList<QByteArrayView> *)0x75046c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    QList<QByteArray> result;
    for (auto it = tzZones->cbegin(), end = tzZones->cend(); it != end; ++it) {
        if (it.value().territory == territory)
            result << it.key();
    }
    std::sort(result.begin(), result.end());

    // Since zone.tab only knows about one territory per zone, and is somewhat
    // incomplete, we may well miss some zones that CLDR associates with the
    // territory. So merge with those from CLDR that we do support.
    const auto unWantedZone = [territory](QByteArrayView id) {
        // We only want to add zones if they are known and we don't already have them:
        auto it = tzZones->constFind(id);
        return it == tzZones->end() || it->territory == territory;
    };
    QList<QByteArrayView> cldrViews = matchingTimeZoneIds(territory);
    std::sort(cldrViews.begin(), cldrViews.end());
    const auto uniqueEnd = std::unique(cldrViews.begin(), cldrViews.end());
    const auto prunedEnd = std::remove_if(cldrViews.begin(), uniqueEnd, unWantedZone);
    const auto cldrSize = std::distance(cldrViews.begin(), prunedEnd);
    if (cldrSize) {
        QList<QByteArray> cldrList;
        cldrList.reserve(cldrSize);
        for (auto it = cldrViews.begin(); it != prunedEnd; ++it)
            cldrList.emplace_back(it->toByteArray());
        QList<QByteArray> joined;
        joined.reserve(result.size() + cldrSize);
        std::set_union(result.begin(), result.end(), cldrList.begin(), cldrList.end(),
                       std::back_inserter(joined));
        result = joined;
    }

    return result;
}